

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::FileDescriptor::InternalDependenciesOnceInit(FileDescriptor *this)

{
  int iVar1;
  FileDescriptor *pFVar2;
  FileDescriptor *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar3;
  LogMessage *in_stack_ffffffffffffff90;
  int local_5c;
  string *in_stack_ffffffffffffffc0;
  DescriptorPool *in_stack_ffffffffffffffc8;
  
  if (((byte)in_RDI[0x41] & 1) != 1) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff90,
               (LogLevel_conflict)((ulong)&stack0xffffffffffffffc0 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    internal::LogFinisher::operator=
              ((LogFinisher *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    internal::LogMessage::~LogMessage((LogMessage *)0x4c7463);
  }
  local_5c = 0;
  while (iVar3 = local_5c, iVar1 = dependency_count(in_RDI), iVar3 < iVar1) {
    if (*(long *)(*(long *)(in_RDI + 0x50) + (long)local_5c * 8) != 0) {
      pFVar2 = DescriptorPool::FindFileByName(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      *(FileDescriptor **)(*(long *)(in_RDI + 0x48) + (long)local_5c * 8) = pFVar2;
    }
    local_5c = local_5c + 1;
  }
  return;
}

Assistant:

void FileDescriptor::InternalDependenciesOnceInit() const {
  GOOGLE_CHECK(finished_building_ == true);
  for (int i = 0; i < dependency_count(); i++) {
    if (dependencies_names_[i]) {
      dependencies_[i] = pool_->FindFileByName(*dependencies_names_[i]);
    }
  }
}